

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::php::anon_unknown_2::GenerateFieldAccessor
          (anon_unknown_2 *this,FieldDescriptor *field,Options *options,Printer *printer)

{
  HeapOrSoo *pHVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  long lVar4;
  string *psVar5;
  anon_unknown_2 extraout_AL;
  anon_unknown_2 aVar6;
  Nonnull<char_*> pcVar7;
  long *plVar8;
  Descriptor *pDVar9;
  FieldDescriptor *pFVar10;
  FieldDescriptor *this_00;
  size_t sVar11;
  _anonymous_namespace_ *p_Var12;
  EnumDescriptor *pEVar13;
  Nonnull<const_char_*> pcVar14;
  undefined1 uVar15;
  AlphaNum *pAVar16;
  long *plVar17;
  char *pcVar18;
  undefined1 *puVar19;
  Options *pOVar20;
  int32_t value_01;
  int line;
  FieldDescriptor *field_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  int32_t extraout_EDX;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined1 auVar22 [8];
  undefined1 cap_first_letter;
  undefined1 cap_first_letter_00;
  undefined1 cap_first_letter_01;
  AlphaNum *in_R8;
  AlphaNum *c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  AlphaNum *in_R9;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view value_02;
  string_view input;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view value_03;
  string_view input_00;
  string_view name_08;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view name_09;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  string_view text_24;
  string_view text_25;
  string_view text_26;
  string_view text_27;
  string_view text_28;
  string_view name_10;
  string_view text_29;
  string_view text_30;
  string_view text_31;
  string_view text_32;
  string_view text_33;
  string_view text_34;
  string_view text_35;
  string_view text_36;
  undefined1 local_268 [8];
  undefined1 local_260 [8];
  undefined1 auStack_258 [40];
  string result;
  undefined1 local_1f0 [48];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [32];
  string deprecation_trigger_with_conditional;
  string deprecation_trigger;
  long *local_150;
  long local_140;
  long lStack_138;
  string local_130;
  undefined1 local_110 [32];
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  long local_60;
  long *local_58;
  int32_t value;
  int32_t value_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  undefined8 uVar21;
  
  uVar15 = SUB81(printer,0);
  auStack_258[0x27] = this[3];
  if ((auStack_258[0x27] & 1) != 0) {
    if (((byte)this[1] & 0x10) == 0) {
      protobuf::internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb63);
    }
    lVar4 = *(long *)(this + 0x28);
    if (lVar4 == 0) {
      protobuf::internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    if ((*(int *)(lVar4 + 4) != 1) || ((*(byte *)(*(long *)(lVar4 + 0x30) + 1) & 2) == 0))
    goto LAB_001e0a20;
    _GLOBAL__N_1::GenerateFieldAccessor((_GLOBAL__N_1 *)local_268);
    aVar6 = extraout_AL;
LAB_001e2110:
    pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        ((bool)uVar15,0xbf < (byte)aVar6,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb54,pcVar14);
    goto LAB_001e21ee;
  }
LAB_001e0a20:
  pAVar16 = (AlphaNum *)0x2;
  GenerateFieldDocComment((Printer *)options,(FieldDescriptor *)this,(Options *)field,2);
  if (*(char *)(*(long *)(this + 0x38) + 0x85) == '\x01') {
    local_268 = (undefined1  [8])0x10;
    local_260 = (undefined1  [8])"@trigger_error(\'";
    result._M_dataplus._M_p = (pointer)(ulong)**(ushort **)(this + 8);
    result._M_string_length = ~(ulong)result._M_dataplus._M_p + (long)*(ushort **)(this + 8);
    pAVar16 = (AlphaNum *)local_1f0;
    local_1f0._0_8_ = (pointer)0x2e;
    local_1f0._8_8_ = " is deprecated.\', E_USER_DEPRECATED);\n        ";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&deprecation_trigger,(lts_20250127 *)local_268,(AlphaNum *)&result,pAVar16,in_R8);
  }
  else {
    deprecation_trigger._M_dataplus._M_p = (pointer)&deprecation_trigger.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&deprecation_trigger,"");
  }
  if (*(char *)(*(long *)(this + 0x38) + 0x85) == '\x01') {
    aVar6 = this[1];
    uVar15 = ((byte)aVar6 & 0x20) >> 5;
    if (0xbf < (byte)aVar6 != (bool)uVar15) goto LAB_001e2110;
    if (((byte)aVar6 & 0x20) == 0) {
      if (((byte)this[3] & 1) == 0) {
        bVar24 = FieldDescriptor::has_presence((FieldDescriptor *)this);
        if (bVar24) {
          local_268 = (undefined1  [8])&DAT_0000000d;
          local_260 = (undefined1  [8])"isset($this->";
          result._M_dataplus._M_p = (pointer)(ulong)**(ushort **)(this + 8);
          result._M_string_length = ~(ulong)result._M_dataplus._M_p + (long)*(ushort **)(this + 8);
          local_1f0._0_8_ = (pointer)0x1;
          local_1f0._8_8_ = ")";
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_130,(lts_20250127 *)local_268,(AlphaNum *)&result,(AlphaNum *)local_1f0,
                     in_R8);
        }
        else {
          local_268 = (undefined1  [8])0x7;
          local_260 = (undefined1  [8])"$this->";
          result._M_dataplus._M_p = (pointer)(ulong)**(ushort **)(this + 8);
          result._M_string_length = ~(ulong)result._M_dataplus._M_p + (long)*(ushort **)(this + 8);
          local_1f0._0_8_ = &DAT_00000005;
          local_1f0._8_8_ = " !== ";
          bVar24 = FieldDescriptor::has_presence((FieldDescriptor *)this);
          if (bVar24) {
            local_110._0_8_ = local_110 + 0x10;
            local_110._16_4_ = 0x6c6c756e;
            local_110._8_8_ = (AlphaNum *)0x4;
            local_110._20_4_ = local_110._20_4_ & 0xffffff00;
          }
          else {
            php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                      ((string *)local_110,(_anonymous_namespace_ *)(ulong)(byte)this[2],field_00);
          }
          local_1c0._0_8_ = local_110._8_8_;
          local_1c0._8_8_ = local_110._0_8_;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_130,(lts_20250127 *)local_268,(AlphaNum *)&result,(AlphaNum *)local_1f0,
                     (AlphaNum *)local_1c0,in_R9);
          if ((AlphaNum *)local_110._0_8_ != (AlphaNum *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_,CONCAT44(local_110._20_4_,local_110._16_4_) + 1)
            ;
          }
        }
      }
      else {
        if (((byte)aVar6 & 0x10) == 0) {
          line = 0xb63;
LAB_001e2232:
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,line);
        }
        lVar4 = *(long *)(this + 0x28);
        if (lVar4 == 0) {
          line = 0xb31;
          goto LAB_001e2232;
        }
        if ((*(int *)(lVar4 + 4) == 1) && ((*(byte *)(*(long *)(lVar4 + 0x30) + 1) & 2) != 0)) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_268,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb64,"!res->is_synthetic()");
          goto LAB_001e21ee;
        }
        local_268 = (undefined1  [8])0x10;
        local_260 = (undefined1  [8])"$this->hasOneof(";
        paVar2 = &result.field_2;
        pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                           (*(int32_t *)(this + 4),paVar2->_M_local_buf);
        result._M_dataplus._M_p = pcVar7 + -(long)paVar2;
        local_1f0._0_8_ = (pointer)0x1;
        local_1f0._8_8_ = ")";
        result._M_string_length = (size_type)paVar2;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_130,(lts_20250127 *)local_268,(AlphaNum *)&result,(AlphaNum *)local_1f0,
                   in_R8);
      }
    }
    else {
      local_268 = (undefined1  [8])0x7;
      local_260 = (undefined1  [8])"$this->";
      result._M_dataplus._M_p = (pointer)(ulong)**(ushort **)(this + 8);
      result._M_string_length = ~(ulong)result._M_dataplus._M_p + (long)*(ushort **)(this + 8);
      local_1f0._0_8_ = (pointer)0xf;
      local_1f0._8_8_ = "->count() !== 0";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_130,(lts_20250127 *)local_268,(AlphaNum *)&result,(AlphaNum *)local_1f0,
                 in_R8);
    }
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x54907f);
    plVar17 = plVar8 + 2;
    if ((long *)*plVar8 == plVar17) {
      local_140 = *plVar17;
      lStack_138 = plVar8[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar17;
      local_150 = (long *)*plVar8;
    }
    local_60 = plVar8[1];
    *plVar8 = (long)plVar17;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    local_58 = local_150;
    local_90.piece_._M_len = 0x10;
    local_90.piece_._M_str = ") {\n            ";
    pAVar16 = &local_c0;
    local_c0.piece_._M_len = deprecation_trigger._M_string_length;
    local_c0.piece_._M_str = deprecation_trigger._M_dataplus._M_p;
    c = &local_f0;
    local_f0.piece_._M_len = 10;
    local_f0.piece_._M_str = "}\n        ";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&deprecation_trigger_with_conditional,(lts_20250127 *)&local_60,&local_90,pAVar16,c,
               in_R9);
    uVar15 = SUB81(c,0);
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    deprecation_trigger_with_conditional._M_dataplus._M_p =
         (pointer)&deprecation_trigger_with_conditional.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&deprecation_trigger_with_conditional,"");
    uVar15 = SUB81(in_R8,0);
  }
  cap_first_letter = SUB81(local_268,0);
  cap_first_letter_00 = SUB81(local_268,0);
  cap_first_letter_01 = SUB81(local_268,0);
  if ((auStack_258[0x27] & 1) == 0) {
    bVar24 = FieldDescriptor::has_presence((FieldDescriptor *)this);
    if ((bVar24) &&
       (pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this), pDVar9 == (Descriptor *)0x0
       )) {
      p_Var12 = (_anonymous_namespace_ *)(ulong)**(ushort **)(this + 8);
      name_06._M_len = ~(ulong)p_Var12 + (long)*(ushort **)(this + 8);
      name_06._M_str = (char *)pAVar16;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_268,p_Var12,name_06,(bool)uVar15);
      local_1f0._0_8_ = ZEXT28(**(ushort **)(this + 8));
      local_1f0._8_8_ = ~local_1f0._0_8_ + (long)*(ushort **)(this + 8);
      php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                (&result,(_anonymous_namespace_ *)(ulong)(byte)this[2],field_02);
      pcVar18 = "camel_name";
      text_18._M_str =
           "public function get^camel_name^()\n{\n    ^deprecation_trigger^return isset($this->^name^) ? $this->^name^ : ^default_value^;\n}\n\n"
      ;
      text_18._M_len = 0x7f;
      cap_first_letter_00 = (char)local_268;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[14],std::__cxx11::string,char[20],std::__cxx11::string>
                ((Printer *)options,text_18,(char (*) [11])0x5b1ab1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 (char (*) [5])0x6fff3e,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_1f0,
                 (char (*) [14])0x688ea7,&result,(char (*) [20])"deprecation_trigger",
                 &deprecation_trigger_with_conditional);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,
                        CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                 result.field_2._M_local_buf[0]) + 1);
      }
      if (local_268 != (undefined1  [8])(local_260 + 8)) {
LAB_001e103f:
        operator_delete((void *)local_268,auStack_258._0_8_ + 1);
      }
    }
    else {
      p_Var12 = (_anonymous_namespace_ *)(ulong)**(ushort **)(this + 8);
      name_01._M_len = ~(ulong)p_Var12 + (long)*(ushort **)(this + 8);
      name_01._M_str = (char *)pAVar16;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_268,p_Var12,name_01,(bool)uVar15);
      result._M_dataplus._M_p = (pointer)(ulong)**(ushort **)(this + 8);
      result._M_string_length = ~(ulong)result._M_dataplus._M_p + (long)*(ushort **)(this + 8);
      pcVar18 = "camel_name";
      text_01._M_str =
           "public function get^camel_name^()\n{\n    ^deprecation_trigger^return $this->^name^;\n}\n\n"
      ;
      text_01._M_len = 0x56;
      cap_first_letter_00 = (char)local_268;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string>
                ((Printer *)options,text_01,(char (*) [11])0x5b1ab1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 (char (*) [5])0x6fff3e,(basic_string_view<char,_std::char_traits<char>_> *)&result,
                 (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
      if (local_268 != (undefined1  [8])(local_260 + 8)) goto LAB_001e103f;
    }
    bVar24 = FieldDescriptor::has_presence((FieldDescriptor *)this);
    if (bVar24) {
      p_Var12 = (_anonymous_namespace_ *)(ulong)**(ushort **)(this + 8);
      name_02._M_len = ~(ulong)p_Var12 + (long)*(ushort **)(this + 8);
      name_02._M_str = pcVar18;
      php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_268,p_Var12,name_02,(bool)cap_first_letter_00);
      local_1f0._0_8_ = ZEXT28(**(ushort **)(this + 8));
      local_1f0._8_8_ = ~local_1f0._0_8_ + (long)*(ushort **)(this + 8);
      php::(anonymous_namespace)::DefaultForField_abi_cxx11_
                (&result,(_anonymous_namespace_ *)(ulong)(byte)this[2],field_01);
      text_02._M_str =
           "public function has^camel_name^()\n{\n    ^deprecation_trigger_with_conditional^return isset($this->^name^);\n}\n\npublic function clear^camel_name^()\n{\n    ^deprecation_trigger^unset($this->^name^);\n}\n\n"
      ;
      text_02._M_len = 0xc6;
      cap_first_letter_00 = (char)local_268;
      io::Printer::
      Print<char[11],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[14],std::__cxx11::string,char[20],std::__cxx11::string,char[37],std::__cxx11::string>
                ((Printer *)options,text_02,(char (*) [11])0x5b1ab1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                 (char (*) [5])0x6fff3e,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_1f0,
                 (char (*) [14])0x688ea7,&result,(char (*) [20])"deprecation_trigger",
                 &deprecation_trigger,(char (*) [37])"deprecation_trigger_with_conditional",
                 &deprecation_trigger_with_conditional);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,
                        CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                 result.field_2._M_local_buf[0]) + 1);
      }
      bVar24 = local_268 == (undefined1  [8])(local_260 + 8);
      goto LAB_001e1131;
    }
  }
  else {
    p_Var12 = (_anonymous_namespace_ *)(ulong)**(ushort **)(this + 8);
    name._M_len = ~(ulong)p_Var12 + (long)*(ushort **)(this + 8);
    name._M_str = (char *)pAVar16;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_268,p_Var12,name,(bool)uVar15);
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              (&result,(_anonymous_namespace_ *)(ulong)*(uint *)(this + 4),value);
    pcVar18 = "camel_name";
    text._M_str = 
    "public function get^camel_name^()\n{\n    ^deprecation_trigger^return $this->readOneof(^number^);\n}\n\n"
    ;
    text._M_len = 99;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string,char[20],std::__cxx11::string>
              ((Printer *)options,text,(char (*) [11])0x5b1ab1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
               (char (*) [7])0x6ca8c3,&result,(char (*) [20])"deprecation_trigger",
               &deprecation_trigger_with_conditional);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,
                      CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                               result.field_2._M_local_buf[0]) + 1);
    }
    if (local_268 != (undefined1  [8])(local_260 + 8)) {
      operator_delete((void *)local_268,auStack_258._0_8_ + 1);
    }
    p_Var12 = (_anonymous_namespace_ *)(ulong)**(ushort **)(this + 8);
    name_00._M_len = ~(ulong)p_Var12 + (long)*(ushort **)(this + 8);
    name_00._M_str = pcVar18;
    php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
              ((string *)local_268,p_Var12,name_00,(bool)cap_first_letter);
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              (&result,(_anonymous_namespace_ *)(ulong)*(uint *)(this + 4),value_00);
    text_00._M_str =
         "public function has^camel_name^()\n{\n    ^deprecation_trigger^return $this->hasOneof(^number^);\n}\n\n"
    ;
    text_00._M_len = 0x62;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string,char[20],std::__cxx11::string>
              ((Printer *)options,text_00,(char (*) [11])0x5b1ab1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
               (char (*) [7])0x6ca8c3,&result,(char (*) [20])"deprecation_trigger",
               &deprecation_trigger_with_conditional);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,
                      CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                               result.field_2._M_local_buf[0]) + 1);
    }
    bVar24 = local_268 == (undefined1  [8])(local_260 + 8);
LAB_001e1131:
    if (!bVar24) {
      operator_delete((void *)local_268,auStack_258._0_8_ + 1);
    }
  }
  if ((this[2] != (anon_unknown_2)0xb) ||
     (bVar24 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this), !bVar24)) {
    aVar6 = this[1];
    bVar24 = (bool)(((byte)aVar6 & 0x20) >> 5);
    if (0xbf < (byte)aVar6 != bVar24) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar24,0xbf < (byte)aVar6,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar14);
      goto LAB_001e21ee;
    }
    if ((((byte)aVar6 & 0x20) == 0) &&
       (puVar19 = FieldDescriptor::kTypeToCppTypeMap,
       *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) == 10)) {
      pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this);
      psVar5 = pDVar9->file_->name_;
      if (psVar5->_M_string_length == 0x1e) {
        pcVar18 = (psVar5->_M_dataplus)._M_p;
        auVar27[0] = -(pcVar18[0xe] == 'f');
        auVar27[1] = -(pcVar18[0xf] == '/');
        auVar27[2] = -(pcVar18[0x10] == 'w');
        auVar27[3] = -(pcVar18[0x11] == 'r');
        auVar27[4] = -(pcVar18[0x12] == 'a');
        auVar27[5] = -(pcVar18[0x13] == 'p');
        auVar27[6] = -(pcVar18[0x14] == 'p');
        auVar27[7] = -(pcVar18[0x15] == 'e');
        auVar27[8] = -(pcVar18[0x16] == 'r');
        auVar27[9] = -(pcVar18[0x17] == 's');
        auVar27[10] = -(pcVar18[0x18] == '.');
        auVar27[0xb] = -(pcVar18[0x19] == 'p');
        auVar27[0xc] = -(pcVar18[0x1a] == 'r');
        auVar27[0xd] = -(pcVar18[0x1b] == 'o');
        auVar27[0xe] = -(pcVar18[0x1c] == 't');
        auVar27[0xf] = -(pcVar18[0x1d] == 'o');
        auVar25[0] = -(*pcVar18 == 'g');
        auVar25[1] = -(pcVar18[1] == 'o');
        auVar25[2] = -(pcVar18[2] == 'o');
        auVar25[3] = -(pcVar18[3] == 'g');
        auVar25[4] = -(pcVar18[4] == 'l');
        auVar25[5] = -(pcVar18[5] == 'e');
        auVar25[6] = -(pcVar18[6] == '/');
        auVar25[7] = -(pcVar18[7] == 'p');
        auVar25[8] = -(pcVar18[8] == 'r');
        auVar25[9] = -(pcVar18[9] == 'o');
        auVar25[10] = -(pcVar18[10] == 't');
        auVar25[0xb] = -(pcVar18[0xb] == 'o');
        auVar25[0xc] = -(pcVar18[0xc] == 'b');
        auVar25[0xd] = -(pcVar18[0xd] == 'u');
        auVar25[0xe] = -(pcVar18[0xe] == 'f');
        auVar25[0xf] = -(pcVar18[0xf] == '/');
        auVar25 = auVar25 & auVar27;
        if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff) {
          pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this);
          name_09._M_str = "value";
          name_09._M_len = 5;
          pFVar10 = Descriptor::FindFieldByName(pDVar9,name_09);
          text_03._M_str = "/**\n";
          text_03._M_len = 4;
          io::Printer::Print<>((Printer *)options,text_03);
          p_Var12 = (_anonymous_namespace_ *)(ulong)**(ushort **)(this + 8);
          name_03._M_len = ~(ulong)p_Var12 + (long)*(ushort **)(this + 8);
          name_03._M_str = puVar19;
          php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                    ((string *)local_268,p_Var12,name_03,(bool)cap_first_letter_00);
          pcVar18 = "camel_name";
          text_04._M_str = " * Returns the unboxed value from <code>get^camel_name^()</code>\n\n";
          text_04._M_len = 0x42;
          io::Printer::Print<char[11],std::__cxx11::string>
                    ((Printer *)options,text_04,(char (*) [11])0x5b1ab1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268)
          ;
          pAVar16 = (AlphaNum *)(local_260 + 8);
          if (local_268 != (undefined1  [8])pAVar16) {
            operator_delete((void *)local_268,auStack_258._0_8_ + 1);
          }
          GenerateDocCommentBody<google::protobuf::FieldDescriptor>
                    ((Printer *)options,(FieldDescriptor *)this);
          FieldDescriptor::DebugString_abi_cxx11_((string *)local_1f0,(FieldDescriptor *)this);
          value_02._M_str = pcVar18;
          value_02._M_len = local_1f0._0_8_;
          php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
                    (&result,(_anonymous_namespace_ *)local_1f0._8_8_,value_02);
          input._M_str = pcVar18;
          input._M_len = (size_t)result._M_dataplus._M_p;
          php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_
                    ((string *)local_268,(_anonymous_namespace_ *)result._M_string_length,input);
          pOVar20 = (Options *)0x569ee7;
          text_05._M_str = " * Generated from protobuf field <code>^def^</code>\n";
          text_05._M_len = 0x34;
          io::Printer::Print<char[4],std::__cxx11::string>
                    ((Printer *)options,text_05,(char (*) [4])0x569ee7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268)
          ;
          if (local_268 != (undefined1  [8])pAVar16) {
            operator_delete((void *)local_268,auStack_258._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != &result.field_2) {
            operator_delete(result._M_dataplus._M_p,
                            CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                     result.field_2._M_local_buf[0]) + 1);
          }
          if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
            operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
          }
          local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffffff000000);
          _local_260 = (undefined1  [16])0x0;
          auStack_258._8_8_ = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
          php::(anonymous_namespace)::PhpGetterTypeName_abi_cxx11_
                    (&result,(_anonymous_namespace_ *)pFVar10,(FieldDescriptor *)local_268,pOVar20);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_260);
          pcVar18 = "php_type";
          text_06._M_str = " * @return ^php_type^|null\n";
          text_06._M_len = 0x1b;
          pbVar23 = &result;
          io::Printer::Print<char[9],std::__cxx11::string>
                    ((Printer *)options,text_06,(char (*) [9])"php_type",&result);
          uVar15 = SUB81(pbVar23,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != &result.field_2) {
            operator_delete(result._M_dataplus._M_p,
                            CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                     result.field_2._M_local_buf[0]) + 1);
          }
          text_07._M_str = " */\n";
          text_07._M_len = 4;
          io::Printer::Print<>((Printer *)options,text_07);
          p_Var12 = (_anonymous_namespace_ *)(ulong)**(ushort **)(this + 8);
          name_04._M_len = ~(ulong)p_Var12 + (long)*(ushort **)(this + 8);
          name_04._M_str = pcVar18;
          php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                    ((string *)local_268,p_Var12,name_04,(bool)uVar15);
          result._M_dataplus._M_p = (pointer)(ulong)**(ushort **)(this + 8);
          result._M_string_length = ~(ulong)result._M_dataplus._M_p + (long)*(ushort **)(this + 8);
          text_08._M_str =
               "public function get^camel_name^Unwrapped()\n{\n    ^deprecation_trigger^return $this->readWrapperValue(\"^field_name^\");\n}\n\n"
          ;
          text_08._M_len = 0x79;
          cap_first_letter_00 = (char)local_268;
          io::Printer::
          Print<char[11],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string>
                    ((Printer *)options,text_08,(char (*) [11])0x5b1ab1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                     (char (*) [11])0x5cc263,
                     (basic_string_view<char,_std::char_traits<char>_> *)&result,
                     (char (*) [20])"deprecation_trigger",&deprecation_trigger_with_conditional);
          if (local_268 != (undefined1  [8])pAVar16) {
            operator_delete((void *)local_268,auStack_258._0_8_ + 1);
          }
        }
      }
    }
  }
  pcVar18 = (char *)0x1;
  GenerateFieldDocComment((Printer *)options,(FieldDescriptor *)this,(Options *)field,1);
  p_Var12 = (_anonymous_namespace_ *)(ulong)**(ushort **)(this + 8);
  name_05._M_len = ~(ulong)p_Var12 + (long)*(ushort **)(this + 8);
  name_05._M_str = pcVar18;
  php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            ((string *)local_268,p_Var12,name_05,(bool)cap_first_letter_00);
  text_09._M_str = "public function set^camel_name^($var)\n{\n";
  text_09._M_len = 0x28;
  io::Printer::Print<char[11],std::__cxx11::string>
            ((Printer *)options,text_09,(char (*) [11])0x5b1ab1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
  if (local_268 != (undefined1  [8])(local_260 + 8)) {
    operator_delete((void *)local_268,auStack_258._0_8_ + 1);
  }
  pHVar1 = &options[2].aggregate_metadata_prefixes.
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_;
  (pHVar1->heap).control =
       (pHVar1->heap).control +
       options[2].aggregate_metadata_prefixes.
       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .settings_.
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
       .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
       capacity_ * 2;
  if ((*(char *)(*(long *)(this + 0x38) + 0x85) == '\x01') &&
     ((this[2] != (anon_unknown_2)0xb ||
      (bVar24 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this), !bVar24)))) {
    aVar6 = this[1];
    bVar24 = (bool)(((byte)aVar6 & 0x20) >> 5);
    if (0xbf < (byte)aVar6 != bVar24) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar24,0xbf < (byte)aVar6,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar14);
      goto LAB_001e21ee;
    }
    if (((byte)aVar6 & 0x20) == 0) {
      pbVar23 = &deprecation_trigger;
      text_10._M_str = "^deprecation_trigger^";
      text_10._M_len = 0x15;
      io::Printer::Print<char[20],std::__cxx11::string>
                ((Printer *)options,text_10,(char (*) [20])"deprecation_trigger",pbVar23);
      cap_first_letter_01 = SUB81(pbVar23,0);
    }
  }
  if ((this[2] == (anon_unknown_2)0xb) &&
     (bVar24 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this), bVar24)) {
    pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this);
    pFVar10 = Descriptor::map_key(pDVar9);
    this_00 = Descriptor::map_value(pDVar9);
    pcVar18 = *(char **)(FieldDescriptor::kTypeToName + (ulong)pFVar10->type_ * 8);
    sVar11 = strlen(pcVar18);
    local_268 = (undefined1  [8])(local_260 + 8);
    _local_260 = (unkuint9)0;
    std::__cxx11::string::resize((ulong)local_268,(char)sVar11);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper((Nonnull<char_*>)local_268,pcVar18,sVar11);
    pcVar18 = *(char **)(FieldDescriptor::kTypeToName + (ulong)this_00->type_ * 8);
    sVar11 = strlen(pcVar18);
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    result._M_dataplus._M_p = (pointer)&result.field_2;
    std::__cxx11::string::resize((ulong)&result,(char)sVar11);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper(result._M_dataplus._M_p,pcVar18,sVar11);
    text_11._M_str =
         "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
    ;
    text_11._M_len = 0x82;
    io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)options,text_11,(char (*) [9])0x61a726,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
               (char (*) [11])0x61a81b,&result);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,
                      CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                               result.field_2._M_local_buf[0]) + 1);
    }
    if (local_268 != (undefined1  [8])(local_260 + 8)) {
      operator_delete((void *)local_268,auStack_258._0_8_ + 1);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4) == 8) {
      pEVar13 = FieldDescriptor::enum_type(this_00);
      FullClassName<google::protobuf::EnumDescriptor>((string *)local_1c0,pEVar13,(Options *)field);
      local_268 = (undefined1  [8])local_1c0._8_8_;
      local_260 = (undefined1  [8])local_1c0._0_8_;
      result._M_dataplus._M_p = (pointer)0x7;
      result._M_string_length = (size_type)anon_var_dwarf_3f4a5a;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_1f0,(lts_20250127 *)local_268,(AlphaNum *)&result,
                 (AlphaNum *)local_1c0._8_8_);
      text_22._M_str = ", \\^class_name^);\n";
      text_22._M_len = 0x12;
      io::Printer::Print<char[11],std::__cxx11::string>
                ((Printer *)options,text_22,(char (*) [11])0x63bd2b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
      uVar21 = extraout_RDX_07;
    }
    else {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4) != 10) {
        text_36._M_str = ");\n";
        text_36._M_len = 3;
        io::Printer::Print<>((Printer *)options,text_36);
        uVar21 = extraout_RDX_11;
        goto LAB_001e1b76;
      }
      pDVar9 = FieldDescriptor::message_type(this_00);
      FullClassName<google::protobuf::Descriptor>((string *)local_1c0,pDVar9,(Options *)field);
      local_268 = (undefined1  [8])local_1c0._8_8_;
      local_260 = (undefined1  [8])local_1c0._0_8_;
      result._M_dataplus._M_p = (pointer)0x7;
      result._M_string_length = (size_type)anon_var_dwarf_3f4a5a;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_1f0,(lts_20250127 *)local_268,(AlphaNum *)&result,
                 (AlphaNum *)local_1c0._8_8_);
      text_12._M_str = ", \\^class_name^);\n";
      text_12._M_len = 0x12;
      io::Printer::Print<char[11],std::__cxx11::string>
                ((Printer *)options,text_12,(char (*) [11])0x63bd2b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
      uVar21 = extraout_RDX;
    }
LAB_001e1b34:
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
      uVar21 = extraout_RDX_08;
    }
    auVar22 = (undefined1  [8])local_1c0._0_8_;
    if ((AlphaNum *)local_1c0._0_8_ != (AlphaNum *)local_1b0) {
LAB_001e1b6e:
      operator_delete((void *)auVar22,local_1b0._0_8_ + 1);
      uVar21 = extraout_RDX_09;
    }
  }
  else {
    aVar6 = this[1];
    bVar24 = (bool)(((byte)aVar6 & 0x20) >> 5);
    if (0xbf < (byte)aVar6 != bVar24) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar24,0xbf < (byte)aVar6,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar14);
      goto LAB_001e21ee;
    }
    if (((byte)aVar6 & 0x20) != 0) {
      pcVar18 = *(char **)(FieldDescriptor::kTypeToName + (ulong)(byte)this[2] * 8);
      sVar11 = strlen(pcVar18);
      local_268 = (undefined1  [8])(local_260 + 8);
      _local_260 = (unkuint9)0;
      std::__cxx11::string::resize((ulong)local_268,(char)sVar11);
      absl::lts_20250127::ascii_internal::AsciiStrToUpper((Nonnull<char_*>)local_268,pcVar18,sVar11)
      ;
      text_13._M_str =
           "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^";
      text_13._M_len = 0x52;
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)options,text_13,(char (*) [5])0x6c7d9a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      if (local_268 != (undefined1  [8])(local_260 + 8)) {
        operator_delete((void *)local_268,auStack_258._0_8_ + 1);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) == 8) {
        pEVar13 = FieldDescriptor::enum_type((FieldDescriptor *)this);
        FullClassName<google::protobuf::EnumDescriptor>
                  ((string *)local_1c0,pEVar13,(Options *)field);
        local_268 = (undefined1  [8])local_1c0._8_8_;
        local_260 = (undefined1  [8])local_1c0._0_8_;
        result._M_dataplus._M_p = (pointer)0x7;
        result._M_string_length = (size_type)anon_var_dwarf_3f4a5a;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_1f0,(lts_20250127 *)local_268,(AlphaNum *)&result,
                   (AlphaNum *)local_1c0._8_8_);
        text_16._M_str = ", \\^class_name^);\n";
        text_16._M_len = 0x12;
        io::Printer::Print<char[11],std::__cxx11::string>
                  ((Printer *)options,text_16,(char (*) [11])0x63bd2b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
        uVar21 = extraout_RDX_02;
      }
      else {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) != 10) {
          text_17._M_str = ");\n";
          text_17._M_len = 3;
          io::Printer::Print<>((Printer *)options,text_17);
          uVar21 = extraout_RDX_03;
          goto LAB_001e1b76;
        }
        pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this);
        FullClassName<google::protobuf::Descriptor>((string *)local_1c0,pDVar9,(Options *)field);
        local_268 = (undefined1  [8])local_1c0._8_8_;
        local_260 = (undefined1  [8])local_1c0._0_8_;
        result._M_dataplus._M_p = (pointer)0x7;
        result._M_string_length = (size_type)anon_var_dwarf_3f4a5a;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_1f0,(lts_20250127 *)local_268,(AlphaNum *)&result,
                   (AlphaNum *)local_1c0._8_8_);
        text_14._M_str = ", \\^class_name^);\n";
        text_14._M_len = 0x12;
        io::Printer::Print<char[11],std::__cxx11::string>
                  ((Printer *)options,text_14,(char (*) [11])0x63bd2b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
        uVar21 = extraout_RDX_00;
      }
      goto LAB_001e1b34;
    }
    uVar3 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4);
    if ((ulong)uVar3 == 8) {
      pEVar13 = FieldDescriptor::enum_type((FieldDescriptor *)this);
      FullClassName<google::protobuf::EnumDescriptor>((string *)local_268,pEVar13,(Options *)field);
      text_20._M_str = "GPBUtil::checkEnum($var, \\^class_name^::class);\n";
      text_20._M_len = 0x30;
      io::Printer::Print<char[11],std::__cxx11::string>
                ((Printer *)options,text_20,(char (*) [11])0x63bd2b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
      uVar21 = extraout_RDX_05;
    }
    else {
      if (uVar3 == 9) {
        local_268 = (undefined1  [8])0x549556;
        if (this[2] == (anon_unknown_2)0x9) {
          local_268 = (undefined1  [8])0x6cbc83;
        }
        text_19._M_str = "GPBUtil::checkString($var, ^utf8^);\n";
        text_19._M_len = 0x24;
        io::Printer::Print<char[5],char_const*>
                  ((Printer *)options,text_19,(char (*) [5])0x63399c,(char **)local_268);
        uVar21 = extraout_RDX_04;
        goto LAB_001e1b76;
      }
      if (uVar3 == 10) {
        pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this);
        FullClassName<google::protobuf::Descriptor>((string *)local_268,pDVar9,(Options *)field);
        text_15._M_str = "GPBUtil::checkMessage($var, \\^class_name^::class);\n";
        text_15._M_len = 0x33;
        io::Printer::Print<char[11],std::__cxx11::string>
                  ((Printer *)options,text_15,(char (*) [11])0x63bd2b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        uVar21 = extraout_RDX_01;
      }
      else {
        puVar19 = FieldDescriptor::kCppTypeToName;
        pcVar18 = *(char **)(FieldDescriptor::kCppTypeToName + (ulong)uVar3 * 8);
        p_Var12 = (_anonymous_namespace_ *)strlen(pcVar18);
        name_07._M_str = puVar19;
        name_07._M_len = (size_t)pcVar18;
        php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                  ((string *)local_268,p_Var12,name_07,(bool)cap_first_letter_01);
        text_21._M_str = "GPBUtil::check^type^($var);\n";
        text_21._M_len = 0x1c;
        io::Printer::Print<char[5],std::__cxx11::string>
                  ((Printer *)options,text_21,(char (*) [5])0x6c7d9a,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        uVar21 = extraout_RDX_06;
      }
    }
    if (local_268 != (undefined1  [8])(local_260 + 8)) {
      local_1b0._0_8_ = auStack_258._0_8_;
      auVar22 = local_268;
      goto LAB_001e1b6e;
    }
  }
LAB_001e1b76:
  value_01 = (int32_t)uVar21;
  if (*(char *)(*(long *)(this + 0x38) + 0x85) == '\x01') {
    if ((this[2] != (anon_unknown_2)0xb) ||
       (bVar24 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this),
       uVar21 = extraout_RDX_10, !bVar24)) {
      aVar6 = this[1];
      value_01 = (int32_t)CONCAT71((int7)((ulong)uVar21 >> 8),0xbf < (byte)aVar6);
      bVar24 = (bool)(((byte)aVar6 & 0x20) >> 5);
      if (0xbf < (byte)aVar6 != bVar24) {
        pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar24,0xbf < (byte)aVar6,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar14);
        goto LAB_001e21ee;
      }
      if (((byte)aVar6 & 0x20) == 0) goto LAB_001e1bd6;
    }
    text_23._M_str = "if ($arr->count() !== 0) {\n    ^deprecation_trigger^}\n";
    text_23._M_len = 0x36;
    io::Printer::Print<char[20],std::__cxx11::string>
              ((Printer *)options,text_23,(char (*) [20])"deprecation_trigger",&deprecation_trigger)
    ;
    value_01 = extraout_EDX;
  }
LAB_001e1bd6:
  if ((auStack_258[0x27] & 1) == 0) {
    aVar6 = this[1];
    bVar24 = (bool)(((byte)aVar6 & 0x20) >> 5);
    if (0xbf < (byte)aVar6 != bVar24) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar24,0xbf < (byte)aVar6,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar14);
      goto LAB_001e21ee;
    }
    if (((byte)aVar6 & 0x20) == 0) {
      local_268 = (undefined1  [8])(ulong)**(ushort **)(this + 8);
      local_260 = (undefined1  [8])(~(ulong)local_268 + (long)*(ushort **)(this + 8));
      text_26._M_str = "$this->^name^ = $var;\n";
      text_26._M_len = 0x16;
      io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
                ((Printer *)options,text_26,(char (*) [5])0x6fff3e,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_268);
    }
    else {
      local_268 = (undefined1  [8])(ulong)**(ushort **)(this + 8);
      local_260 = (undefined1  [8])(~(ulong)local_268 + (long)*(ushort **)(this + 8));
      text_25._M_str = "$this->^name^ = $arr;\n";
      text_25._M_len = 0x16;
      io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
                ((Printer *)options,text_25,(char (*) [5])0x6fff3e,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_268);
    }
  }
  else {
    php::(anonymous_namespace)::IntToString_abi_cxx11_
              ((string *)local_268,(_anonymous_namespace_ *)(ulong)*(uint *)(this + 4),value_01);
    text_24._M_str = "$this->writeOneof(^number^, $var);\n";
    text_24._M_len = 0x23;
    io::Printer::Print<char[7],std::__cxx11::string>
              ((Printer *)options,text_24,(char (*) [7])0x6ca8c3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
    if (local_268 != (undefined1  [8])(local_260 + 8)) {
      operator_delete((void *)local_268,auStack_258._0_8_ + 1);
    }
  }
  text_27._M_str = "\nreturn $this;\n";
  text_27._M_len = 0xf;
  io::Printer::Print<>((Printer *)options,text_27);
  io::Printer::Outdent((Printer *)options);
  io::Printer::Outdent((Printer *)options);
  text_28._M_str = "}\n\n";
  text_28._M_len = 3;
  io::Printer::Print<>((Printer *)options,text_28);
  if ((this[2] != (anon_unknown_2)0xb) ||
     (bVar24 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this), !bVar24)) {
    aVar6 = this[1];
    bVar24 = (bool)(((byte)aVar6 & 0x20) >> 5);
    if (0xbf < (byte)aVar6 != bVar24) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar24,0xbf < (byte)aVar6,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar14);
LAB_001e21ee:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_268);
    }
    if ((((byte)aVar6 & 0x20) == 0) &&
       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) == 10)) {
      pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this);
      psVar5 = pDVar9->file_->name_;
      if (psVar5->_M_string_length == 0x1e) {
        pcVar18 = (psVar5->_M_dataplus)._M_p;
        auVar28[0] = -(pcVar18[0xe] == 'f');
        auVar28[1] = -(pcVar18[0xf] == '/');
        auVar28[2] = -(pcVar18[0x10] == 'w');
        auVar28[3] = -(pcVar18[0x11] == 'r');
        auVar28[4] = -(pcVar18[0x12] == 'a');
        auVar28[5] = -(pcVar18[0x13] == 'p');
        auVar28[6] = -(pcVar18[0x14] == 'p');
        auVar28[7] = -(pcVar18[0x15] == 'e');
        auVar28[8] = -(pcVar18[0x16] == 'r');
        auVar28[9] = -(pcVar18[0x17] == 's');
        auVar28[10] = -(pcVar18[0x18] == '.');
        auVar28[0xb] = -(pcVar18[0x19] == 'p');
        auVar28[0xc] = -(pcVar18[0x1a] == 'r');
        auVar28[0xd] = -(pcVar18[0x1b] == 'o');
        auVar28[0xe] = -(pcVar18[0x1c] == 't');
        auVar28[0xf] = -(pcVar18[0x1d] == 'o');
        auVar26[0] = -(*pcVar18 == 'g');
        auVar26[1] = -(pcVar18[1] == 'o');
        auVar26[2] = -(pcVar18[2] == 'o');
        auVar26[3] = -(pcVar18[3] == 'g');
        auVar26[4] = -(pcVar18[4] == 'l');
        auVar26[5] = -(pcVar18[5] == 'e');
        auVar26[6] = -(pcVar18[6] == '/');
        auVar26[7] = -(pcVar18[7] == 'p');
        auVar26[8] = -(pcVar18[8] == 'r');
        auVar26[9] = -(pcVar18[9] == 'o');
        auVar26[10] = -(pcVar18[10] == 't');
        auVar26[0xb] = -(pcVar18[0xb] == 'o');
        auVar26[0xc] = -(pcVar18[0xc] == 'b');
        auVar26[0xd] = -(pcVar18[0xd] == 'u');
        auVar26[0xe] = -(pcVar18[0xe] == 'f');
        auVar26[0xf] = -(pcVar18[0xf] == '/');
        auVar26 = auVar26 & auVar28;
        if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
          pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this);
          name_10._M_str = "value";
          name_10._M_len = 5;
          pFVar10 = Descriptor::FindFieldByName(pDVar9,name_10);
          text_29._M_str = "/**\n";
          text_29._M_len = 4;
          io::Printer::Print<>((Printer *)options,text_29);
          pDVar9 = FieldDescriptor::message_type((FieldDescriptor *)this);
          local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffffff000000);
          _local_260 = (undefined1  [16])0x0;
          auStack_258._8_8_ = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
          FullClassName<google::protobuf::Descriptor>(&result,pDVar9,(Options *)local_268);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_260);
          pcVar18 = "message_name";
          text_30._M_str =
               " * Sets the field by wrapping a primitive type in a ^message_name^ object.\n\n";
          text_30._M_len = 0x4c;
          io::Printer::Print<char[13],std::__cxx11::string>
                    ((Printer *)options,text_30,(char (*) [13])"message_name",&result);
          paVar2 = &result.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != paVar2) {
            operator_delete(result._M_dataplus._M_p,
                            CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                     result.field_2._M_local_buf[0]) + 1);
          }
          GenerateDocCommentBody<google::protobuf::FieldDescriptor>
                    ((Printer *)options,(FieldDescriptor *)this);
          FieldDescriptor::DebugString_abi_cxx11_((string *)local_1f0,(FieldDescriptor *)this);
          value_03._M_str = pcVar18;
          value_03._M_len = local_1f0._0_8_;
          php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
                    (&result,(_anonymous_namespace_ *)local_1f0._8_8_,value_03);
          input_00._M_str = pcVar18;
          input_00._M_len = (size_t)result._M_dataplus._M_p;
          php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_
                    ((string *)local_268,(_anonymous_namespace_ *)result._M_string_length,input_00);
          pOVar20 = (Options *)0x569ee7;
          text_31._M_str = " * Generated from protobuf field <code>^def^</code>\n";
          text_31._M_len = 0x34;
          io::Printer::Print<char[4],std::__cxx11::string>
                    ((Printer *)options,text_31,(char (*) [4])0x569ee7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268)
          ;
          if (local_268 != (undefined1  [8])(local_260 + 8)) {
            operator_delete((void *)local_268,auStack_258._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != paVar2) {
            operator_delete(result._M_dataplus._M_p,
                            CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                     result.field_2._M_local_buf[0]) + 1);
          }
          if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
            operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
          }
          local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffffff000000);
          _local_260 = (undefined1  [16])0x0;
          auStack_258._8_8_ = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
          php::(anonymous_namespace)::PhpSetterTypeName_abi_cxx11_
                    (&result,(_anonymous_namespace_ *)pFVar10,(FieldDescriptor *)local_268,pOVar20);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_260);
          pcVar18 = "php_type";
          text_32._M_str = " * @param ^php_type^|null $var\n";
          text_32._M_len = 0x1f;
          pbVar23 = &result;
          io::Printer::Print<char[9],std::__cxx11::string>
                    ((Printer *)options,text_32,(char (*) [9])"php_type",&result);
          uVar15 = SUB81(pbVar23,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != paVar2) {
            operator_delete(result._M_dataplus._M_p,
                            CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                     result.field_2._M_local_buf[0]) + 1);
          }
          text_33._M_str = " * @return $this\n";
          text_33._M_len = 0x11;
          io::Printer::Print<>((Printer *)options,text_33);
          text_34._M_str = " */\n";
          text_34._M_len = 4;
          io::Printer::Print<>((Printer *)options,text_34);
          p_Var12 = (_anonymous_namespace_ *)(ulong)**(ushort **)(this + 8);
          name_08._M_len = ~(ulong)p_Var12 + (long)*(ushort **)(this + 8);
          name_08._M_str = pcVar18;
          php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                    ((string *)local_268,p_Var12,name_08,(bool)uVar15);
          result._M_dataplus._M_p = (pointer)(ulong)**(ushort **)(this + 8);
          result._M_string_length = ~(ulong)result._M_dataplus._M_p + (long)*(ushort **)(this + 8);
          text_35._M_str =
               "public function set^camel_name^Unwrapped($var)\n{\n    $this->writeWrapperValue(\"^field_name^\", $var);\n    return $this;}\n\n"
          ;
          text_35._M_len = 0x79;
          io::Printer::
          Print<char[11],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
                    ((Printer *)options,text_35,(char (*) [11])0x5b1ab1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                     (char (*) [11])0x5cc263,
                     (basic_string_view<char,_std::char_traits<char>_> *)&result);
          if (local_268 != (undefined1  [8])(local_260 + 8)) {
            operator_delete((void *)local_268,auStack_258._0_8_ + 1);
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)deprecation_trigger_with_conditional._M_dataplus._M_p !=
      &deprecation_trigger_with_conditional.field_2) {
    operator_delete(deprecation_trigger_with_conditional._M_dataplus._M_p,
                    deprecation_trigger_with_conditional.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)deprecation_trigger._M_dataplus._M_p != &deprecation_trigger.field_2) {
    operator_delete(deprecation_trigger._M_dataplus._M_p,
                    deprecation_trigger.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, const Options& options,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->real_containing_oneof();

  // Generate getter.
  GenerateFieldDocComment(printer, field, options, kFieldGetter);

  // deprecation
  std::string deprecation_trigger =
      (field->options().deprecated())
          ? absl::StrCat("@trigger_error('", field->name(),
                         " is deprecated.', E_USER_DEPRECATED);\n        ")
          : "";
  std::string deprecation_trigger_with_conditional =
      (field->options().deprecated())
          ? absl::StrCat("if (" + DeprecatedConditionalForField(field),
                         ") {\n            ", deprecation_trigger,
                         "}\n        ")
          : "";

  // Emit getter.
  if (oneof != nullptr) {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "number",
        IntToString(field->number()), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  } else if (field->has_presence() && !field->message_type()) {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return isset($this->^name^) ? $this->^name^ "
        ": ^default_value^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "default_value", DefaultForField(field),
        "deprecation_trigger", deprecation_trigger_with_conditional);
  } else {
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  }

  // Emit hazzers/clear.
  if (oneof) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^return $this->hasOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "number",
        IntToString(field->number()), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  } else if (field->has_presence()) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger_with_conditional^return isset($this->^name^);"
        "\n}\n\n"
        "public function clear^camel_name^()\n"
        "{\n"
        "    ^deprecation_trigger^unset($this->^name^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name(), "default_value", DefaultForField(field),
        "deprecation_trigger", deprecation_trigger,
        "deprecation_trigger_with_conditional",
        deprecation_trigger_with_conditional);
  }

  // For wrapper types, generate an additional getXXXUnwrapped getter
  if (!field->is_map() && !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldGetterDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^Unwrapped()\n"
        "{\n"
        "    ^deprecation_trigger^return "
        "$this->readWrapperValue(\"^field_name^\");\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "field_name",
        field->name(), "deprecation_trigger",
        deprecation_trigger_with_conditional);
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field, options, kFieldSetter);
  printer->Print(
      "public function set^camel_name^($var)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));

  Indent(printer);

  if (field->options().deprecated() && !field->is_map() &&
      !field->is_repeated()) {
    printer->Print("^deprecation_trigger^", "deprecation_trigger",
                   deprecation_trigger);
  }

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->map_key();
    const FieldDescriptor* value = map_entry->map_value();
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", absl::AsciiStrToUpper(key->type_name()), "value_type",
        absl::AsciiStrToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(", \\^class_name^);\n", "class_name",
                     absl::StrCat(FullClassName(value->message_type(), options),
                                  "::class"));
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n", "class_name",
          absl::StrCat(FullClassName(value->enum_type(), options), "::class"));
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", absl::AsciiStrToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(", \\^class_name^);\n", "class_name",
                     absl::StrCat(FullClassName(field->message_type(), options),
                                  "::class"));
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n", "class_name",
          absl::StrCat(FullClassName(field->enum_type(), options), "::class"));
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print("GPBUtil::checkMessage($var, \\^class_name^::class);\n",
                   "class_name", FullClassName(field->message_type(), options));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print("GPBUtil::checkEnum($var, \\^class_name^::class);\n",
                   "class_name", FullClassName(field->enum_type(), options));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n", "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True" : "False");
  } else {
    printer->Print("GPBUtil::check^type^($var);\n", "type",
                   UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (field->options().deprecated() &&
      (field->is_map() || field->is_repeated())) {
    printer->Print("if ($arr->count() !== 0) {\n    ^deprecation_trigger^}\n",
                   "deprecation_trigger", deprecation_trigger);
  }

  if (oneof != nullptr) {
    printer->Print("$this->writeOneof(^number^, $var);\n", "number",
                   IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print("$this->^name^ = $arr;\n", "name", field->name());
  } else {
    printer->Print("$this->^name^ = $var;\n", "name", field->name());
  }

  printer->Print("\nreturn $this;\n");

  Outdent(printer);

  printer->Print("}\n\n");

  // For wrapper types, generate an additional setXXXValue getter
  if (!field->is_map() && !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldSetterDocComment(printer, field);
    printer->Print(
        "public function set^camel_name^Unwrapped($var)\n"
        "{\n"
        "    $this->writeWrapperValue(\"^field_name^\", $var);\n"
        "    return $this;"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "field_name",
        field->name());
  }
}